

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

bool ECC_InitSanityCheck(void)

{
  bool bVar1;
  long in_FS_OFFSET;
  CPubKey pubkey;
  undefined1 auStack_68 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_60;
  CPubKey local_51;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(auStack_68,0));
  CKey::GetPubKey(&local_51,(CKey *)auStack_68);
  bVar1 = CKey::VerifyPubKey((CKey *)auStack_68,&local_51);
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_60._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60,
               local_60._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ECC_InitSanityCheck() {
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();
    return key.VerifyPubKey(pubkey);
}